

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

FileName * __thiscall embree::FileName::dropExt(FileName *__return_storage_ptr__,FileName *this)

{
  long lVar1;
  string sStack_38;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2e);
  if (lVar1 == -1) {
    FileName(__return_storage_ptr__,&this->filename);
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this);
    FileName(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::dropExt() const {
    size_t pos = filename.find_last_of('.');
    if (pos == std::string::npos) return filename;
    return filename.substr(0,pos);
  }